

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_internal.cc
# Opt level: O1

void __thiscall
absl::lts_20250127::status_internal::StatusRep::ForEachPayload
          (StatusRep *this,
          FunctionRef<void_(std::basic_string_view<char,_std::char_traits<char>_>,_const_absl::lts_20250127::Cord_&)>
          visitor)

{
  InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
  *this_00;
  ulong uVar1;
  pointer pcVar2;
  reference pVVar3;
  long lVar4;
  ulong uVar5;
  size_type i;
  size_type sVar6;
  type tVar7;
  long *local_60;
  size_t local_58;
  long local_50 [2];
  VoidPtr local_40;
  Invoker<void,_std::basic_string_view<char>,_const_absl::lts_20250127::Cord_&> local_38;
  
  local_38 = visitor.invoker_;
  local_40 = visitor.ptr_;
  this_00 = (this->payloads_)._M_t.
            super___uniq_ptr_impl<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_*,_std::default_delete<absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_>_>
            .
            super__Head_base<0UL,_absl::lts_20250127::InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>_*,_false>
            ._M_head_impl;
  if (this_00 !=
      (InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
       *)0x0) {
    uVar1 = *(ulong *)&(this_00->storage_).metadata_;
    uVar5 = *(ulong *)&(this_00->storage_).metadata_;
    if (1 < uVar5) {
      uVar5 = uVar5 >> 1;
      lVar4 = -1;
      sVar6 = 0;
      do {
        i = uVar5 + lVar4;
        if (uVar1 < 4 || (ulong)this_00 % 0xd < 7) {
          i = sVar6;
        }
        pVVar3 = InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
                 ::operator[](this_00,i);
        pcVar2 = (pVVar3->type_url)._M_dataplus._M_p;
        local_60 = local_50;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_60,pcVar2,pcVar2 + (pVVar3->type_url)._M_string_length);
        tVar7._M_str = (char *)local_60;
        tVar7._M_len = local_58;
        (*local_38)(local_40,tVar7,&pVVar3->payload);
        if (local_60 != local_50) {
          operator_delete(local_60,local_50[0] + 1);
        }
        sVar6 = sVar6 + 1;
        uVar5 = *(ulong *)&(this_00->storage_).metadata_ >> 1;
        lVar4 = lVar4 + -1;
      } while (sVar6 < uVar5);
    }
  }
  return;
}

Assistant:

void StatusRep::ForEachPayload(
    absl::FunctionRef<void(absl::string_view, const absl::Cord&)> visitor)
    const {
  if (auto* payloads = payloads_.get()) {
    bool in_reverse =
        payloads->size() > 1 && reinterpret_cast<uintptr_t>(payloads) % 13 > 6;

    for (size_t index = 0; index < payloads->size(); ++index) {
      const auto& elem =
          (*payloads)[in_reverse ? payloads->size() - 1 - index : index];

#ifdef NDEBUG
      visitor(elem.type_url, elem.payload);
#else
      // In debug mode invalidate the type url to prevent users from relying on
      // this string lifetime.

      // NOLINTNEXTLINE intentional extra conversion to force temporary.
      visitor(std::string(elem.type_url), elem.payload);
#endif  // NDEBUG
    }
  }
}